

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdSArray.h
# Opt level: O2

bool __thiscall HACD::SArray<long,_16UL>::Erase(SArray<long,_16UL> *this,long *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  SArray<long,_16UL> *pSVar2;
  size_t pos;
  ulong local_18;
  
  local_18 = CONCAT71(in_register_00000001,in_AL);
  pSVar2 = this;
  if (this->m_maxSize != 0x10) {
    pSVar2 = (SArray<long,_16UL> *)this->m_data;
  }
  bVar1 = Find(this,value,&local_18);
  if (bVar1) {
    while( true ) {
      if (this->m_size <= local_18 + 1) break;
      pSVar2->m_data0[local_18] = pSVar2->m_data0[local_18 + 1];
      local_18 = local_18 + 1;
    }
    this->m_size = this->m_size - 1;
  }
  return bVar1;
}

Assistant:

bool                    Erase(const T & value)
                                    {
                                        size_t pos;
                                        T * const data = Data();
                                        if (Find(value, pos))
                                        {
                                            for(size_t j = pos+1;  j < m_size; ++j)
                                                data[j-1] = data[j];
                                            --m_size;
                                            return true;
                                        }
                                        return false;
                                    }